

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scheduler_tests.cpp
# Opt level: O3

void scheduler_tests::microTask
               (CScheduler *s,mutex *mutex,int *counter,int delta,time_point rescheduleTime)

{
  Function f;
  int iVar1;
  undefined8 uVar2;
  long in_FS_OFFSET;
  undefined8 in_stack_ffffffffffffff78;
  CScheduler *pCVar3;
  _Any_data in_stack_ffffffffffffff88;
  _Manager_type local_68;
  _Any_data local_58;
  code *local_48;
  code *local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  iVar1 = pthread_mutex_lock((pthread_mutex_t *)mutex);
  if (iVar1 == 0) {
    *counter = *counter + delta;
    pthread_mutex_unlock((pthread_mutex_t *)mutex);
    local_58._8_8_ = 0;
    local_58._M_unused._M_object = operator_new(0x30);
    *(code **)local_58._M_unused._0_8_ = microTask;
    *(undefined8 *)((long)local_58._M_unused._0_8_ + 8) = 0x8000000000000000;
    *(int *)((long)local_58._M_unused._0_8_ + 0x10) = 1 - delta;
    *(int **)((long)local_58._M_unused._0_8_ + 0x18) = counter;
    *(mutex **)((long)local_58._M_unused._0_8_ + 0x20) = mutex;
    *(CScheduler **)((long)local_58._M_unused._0_8_ + 0x28) = s;
    local_40 = std::
               _Function_handler<void_(),_std::_Bind<void_(*(std::reference_wrapper<CScheduler>,_std::reference_wrapper<std::mutex>,_std::reference_wrapper<int>,_int,_std::chrono::time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>))(CScheduler_&,_std::mutex_&,_int_&,_int,_std::chrono::time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>)>_>
               ::_M_invoke;
    local_48 = std::
               _Function_handler<void_(),_std::_Bind<void_(*(std::reference_wrapper<CScheduler>,_std::reference_wrapper<std::mutex>,_std::reference_wrapper<int>,_int,_std::chrono::time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>))(CScheduler_&,_std::mutex_&,_int_&,_int,_std::chrono::time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>)>_>
               ::_M_manager;
    pCVar3 = s;
    std::function<void_()>::function
              ((function<void_()> *)&stack0xffffffffffffff88,(function<void_()> *)&local_58);
    f.super__Function_base._M_functor._8_8_ = pCVar3;
    f.super__Function_base._M_functor._M_unused._M_object = (void *)in_stack_ffffffffffffff78;
    f._16_16_ = in_stack_ffffffffffffff88;
    CScheduler::schedule(s,f,(time_point)&stack0xffffffffffffff88);
    if (local_68 != (_Manager_type)0x0) {
      (*local_68)((_Any_data *)&stack0xffffffffffffff88,(_Any_data *)&stack0xffffffffffffff88,
                  __destroy_functor);
    }
    if (local_48 != (code *)0x0) {
      (*local_48)(&local_58,&local_58,__destroy_functor);
    }
    if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
      return;
    }
  }
  else if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    uVar2 = std::__throw_system_error(iVar1);
    __clang_call_terminate(uVar2);
  }
  __stack_chk_fail();
}

Assistant:

static void microTask(CScheduler& s, std::mutex& mutex, int& counter, int delta, std::chrono::steady_clock::time_point rescheduleTime)
{
    {
        std::lock_guard<std::mutex> lock(mutex);
        counter += delta;
    }
    auto noTime = std::chrono::steady_clock::time_point::min();
    if (rescheduleTime != noTime) {
        CScheduler::Function f = std::bind(&microTask, std::ref(s), std::ref(mutex), std::ref(counter), -delta + 1, noTime);
        s.schedule(f, rescheduleTime);
    }
}